

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O3

double cupdlp_dcs_norm(cupdlp_dcs *A)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = -1.0;
  if (((A != (cupdlp_dcs *)0x0) && (A->nz == -1)) && (A->x != (double *)0x0)) {
    if ((long)A->n < 1) {
      return 0.0;
    }
    dVar5 = 0.0;
    lVar2 = 0;
    iVar3 = *A->p;
    do {
      iVar1 = A->p[lVar2 + 1];
      dVar6 = 0.0;
      if (iVar3 < iVar1) {
        lVar4 = (long)iVar3;
        do {
          dVar6 = dVar6 + ABS(A->x[lVar4]);
          lVar4 = lVar4 + 1;
        } while (iVar1 != lVar4);
      }
      if (dVar5 <= dVar6) {
        dVar5 = dVar6;
      }
      lVar2 = lVar2 + 1;
      iVar3 = iVar1;
    } while (lVar2 != A->n);
  }
  return dVar5;
}

Assistant:

double cupdlp_dcs_norm(const cupdlp_dcs *A) {
  int p, j, n, *Ap;
  double *Ax;
  double nrm = 0, s;
  if (!IS_CSC(A) || !A->x) return (-1); /* check inputs */
  n = A->n;
  Ap = A->p;
  Ax = A->x;
  for (j = 0; j < n; j++) {
    for (s = 0, p = Ap[j]; p < Ap[j + 1]; p++) s += fabs(Ax[p]);
    nrm = MAX(nrm, s);
  }
  return (nrm);
}